

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall HostVector_value_constructor_Test::TestBody(HostVector_value_constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type *psVar3;
  reference expected;
  Range RVar4;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  size_type i;
  iterator __end1;
  iterator __begin1;
  Range *__range1;
  Message local_60;
  int local_58 [4];
  size_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  HostVector<int> v1;
  HostVector_value_constructor_Test *this_local;
  
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<int,int,void,void>
            ((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)&gtest_ar.message_,10,-5);
  local_48 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::size((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)&gtest_ar.message_);
  local_58[0] = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_40,"v1.size()","10",&local_48,local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__range1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__range1,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  RVar4 = memory::
          ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::range((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                   *)&gtest_ar.message_);
  __begin1.index_ = RVar4.left_;
  __end1 = memory::Range::begin((Range *)&__begin1);
  i = (size_type)memory::Range::end((Range *)&__begin1);
  while (bVar1 = memory::Range::iterator::operator!=(&__end1,(iterator *)&i), bVar1) {
    psVar3 = memory::Range::iterator::operator*(&__end1);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar3;
    expected = memory::
               ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
               ::operator[]((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                             *)&gtest_ar.message_,(size_type)gtest_ar_1.message_.ptr_);
    local_ac = -5;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_a8,"v1[i]","-5",expected,&local_ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x77,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    memory::Range::iterator::operator++(&__end1);
  }
  memory::
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(HostVector, value_constructor) {
    using namespace memory;

    HostVector<int> v1(10, -5);

    EXPECT_EQ(v1.size(), 10);
    for(auto i : v1.range()) {
        EXPECT_EQ(v1[i], -5);
    }
}